

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.h
# Opt level: O0

Version * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_internal_mutable_compiler_version
          (CodeGeneratorRequest *this)

{
  Arena *arena;
  Version *pVVar1;
  Version *p;
  CodeGeneratorRequest *this_local;
  
  if ((this->field_0)._impl_.compiler_version_ == (Version *)0x0) {
    arena = MessageLite::GetArena((MessageLite *)this);
    pVVar1 = (Version *)Arena::DefaultConstruct<google::protobuf::compiler::Version>(arena);
    (this->field_0)._impl_.compiler_version_ = pVVar1;
  }
  return (this->field_0)._impl_.compiler_version_;
}

Assistant:

inline ::google::protobuf::compiler::Version* PROTOBUF_NONNULL CodeGeneratorRequest::_internal_mutable_compiler_version() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.compiler_version_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::compiler::Version>(GetArena());
    _impl_.compiler_version_ = reinterpret_cast<::google::protobuf::compiler::Version*>(p);
  }
  return _impl_.compiler_version_;
}